

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

char * file_base(char *path)

{
  Boolean BVar1;
  size_t sVar2;
  bool bVar3;
  char *local_20;
  char *src;
  char *path_local;
  
  sVar2 = strlen(path);
  local_20 = path + (sVar2 - 1);
  if (local_20 < path) {
    path_local = (char *)0x0;
  }
  else {
    while( true ) {
      bVar3 = false;
      if (local_20 != path) {
        BVar1 = is_seperator((int)local_20[-1]);
        bVar3 = BVar1 == LEMON_FALSE;
      }
      if (!bVar3) break;
      local_20 = local_20 + -1;
    }
    path_local = local_20;
  }
  return path_local;
}

Assistant:

const char *file_base(const char *path)
{
  const char *src = path + strlen(path) - 1;
  if( src >= path ){
    // back up until a / or the start
    while (src != path && !is_seperator(*(src - 1)))
      src--;

    // Check for files with drive specification but no path
#if defined(_WIN32) || defined(DOS)
    if( src == path && src[0] != 0 ){
      if( src[1] == ':' )
        src += 2;
    }
#endif
    return src;
  }
  return NULL;
}